

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O3

int channel_mix_2_0_to_5_1(mixed_segment *segment)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 *puVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint32_t frames;
  float *lfe;
  float *ce;
  float *rr;
  float *rl;
  float *fr;
  float *fl;
  float *r;
  float *l;
  uint32_t local_54;
  float *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  float *local_30;
  float *local_28;
  float *local_20;
  float *local_18;
  
  puVar5 = (undefined8 *)segment->data;
  local_54 = 0xffffffff;
  mixed_buffer_request_read(&local_18,&local_54,(mixed_buffer *)*puVar5);
  mixed_buffer_request_read(&local_20,&local_54,(mixed_buffer *)puVar5[1]);
  mixed_buffer_request_write(&local_28,&local_54,(mixed_buffer *)puVar5[0xe]);
  mixed_buffer_request_write(&local_30,&local_54,(mixed_buffer *)puVar5[0xf]);
  mixed_buffer_request_write(&local_38,&local_54,(mixed_buffer *)puVar5[0x10]);
  mixed_buffer_request_write(&local_40,&local_54,(mixed_buffer *)puVar5[0x11]);
  mixed_buffer_request_write(&local_48,&local_54,(mixed_buffer *)puVar5[0x12]);
  mixed_buffer_request_write(&local_50,&local_54,(mixed_buffer *)puVar5[0x13]);
  if ((ulong)local_54 != 0) {
    uVar6 = 0;
    do {
      fVar1 = local_18[uVar6];
      fVar2 = local_20[uVar6];
      fVar7 = (fVar1 + fVar2) * 0.5;
      fVar3 = *(float *)((long)puVar5 + 0xe4);
      fVar4 = *(float *)((long)puVar5 + 0xec);
      fVar8 = ((*(float *)((long)puVar5 + 0x104) * *(float *)(puVar5 + 0x1d) +
               *(float *)((long)puVar5 + 0xfc) * fVar7 + *(float *)(puVar5 + 0x20) * fVar3) -
              *(float *)((long)puVar5 + 0xf4) * fVar4) -
              *(float *)(puVar5 + 0x1f) * *(float *)(puVar5 + 0x1e);
      *(float *)((long)puVar5 + 0xe4) = fVar7;
      *(float *)(puVar5 + 0x1d) = fVar3;
      *(float *)((long)puVar5 + 0xec) = fVar8;
      *(float *)(puVar5 + 0x1e) = fVar4;
      fVar3 = *(float *)(puVar5 + 0x21);
      fVar4 = *(float *)(puVar5 + 0x22);
      fVar9 = ((*(float *)(puVar5 + 0x25) * *(float *)((long)puVar5 + 0x10c) +
               *(float *)(puVar5 + 0x24) * fVar7 + *(float *)((long)puVar5 + 0x124) * fVar3) -
              *(float *)(puVar5 + 0x23) * fVar4) -
              *(float *)((long)puVar5 + 0x11c) * *(float *)((long)puVar5 + 0x114);
      *(float *)(puVar5 + 0x21) = fVar7;
      *(float *)((long)puVar5 + 0x10c) = fVar3;
      *(float *)(puVar5 + 0x22) = fVar9;
      *(float *)((long)puVar5 + 0x114) = fVar4;
      local_28[uVar6] = fVar1;
      local_30[uVar6] = fVar2;
      local_38[uVar6] = (fVar7 * -0.5 + fVar1 + fVar1) * 0.571;
      local_40[uVar6] = (fVar7 * -0.5 + fVar2 + fVar2) * 0.571;
      local_48[uVar6] = fVar8;
      local_50[uVar6] = fVar9;
      uVar6 = uVar6 + 1;
    } while (local_54 != uVar6);
  }
  mixed_buffer_finish_read(local_54,(mixed_buffer *)*puVar5);
  mixed_buffer_finish_read(local_54,(mixed_buffer *)puVar5[1]);
  mixed_buffer_finish_write(local_54,(mixed_buffer *)puVar5[0xe]);
  mixed_buffer_finish_write(local_54,(mixed_buffer *)puVar5[0xf]);
  mixed_buffer_finish_write(local_54,(mixed_buffer *)puVar5[0x10]);
  mixed_buffer_finish_write(local_54,(mixed_buffer *)puVar5[0x11]);
  mixed_buffer_finish_write(local_54,(mixed_buffer *)puVar5[0x12]);
  mixed_buffer_finish_write(local_54,(mixed_buffer *)puVar5[0x13]);
  return 1;
}

Assistant:

VECTORIZE int channel_mix_2_0_to_5_1(struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;

  uint32_t frames = UINT32_MAX;
  float *restrict l, *restrict r, *restrict fl, *restrict fr, *restrict rl, *restrict rr, *restrict ce, *restrict lfe;
  mixed_buffer_request_read(&l, &frames, data->in[MIXED_LEFT]);
  mixed_buffer_request_read(&r, &frames, data->in[MIXED_RIGHT]);
  mixed_buffer_request_write(&fl, &frames, data->out[MIXED_LEFT_FRONT]);
  mixed_buffer_request_write(&fr, &frames, data->out[MIXED_RIGHT_FRONT]);
  mixed_buffer_request_write(&rl, &frames, data->out[MIXED_LEFT_REAR]);
  mixed_buffer_request_write(&rr, &frames, data->out[MIXED_RIGHT_REAR]);
  mixed_buffer_request_write(&ce, &frames, data->out[MIXED_CENTER]);
  mixed_buffer_request_write(&lfe, &frames, data->out[MIXED_SUBWOOFER]);
  for(uint32_t i=0; i<frames; ++i){
    float li = l[i];
    float ri = r[i];

    float c = (li+ri)*0.5f;
    float ci = biquad_sample(c, &data->lp[0]);
    float lfei = biquad_sample(c, &data->lp[1]);
    float rli = 0.571f * (li + (li - 0.5f * c));
    float rri = 0.571f * (ri + (ri - 0.5f * c));

    // FIXME: Hilbert is fucked. Reinstate when it works again.
    /* float r = biquad_sample(s, &data->lp[2]); */
    /* // 90 deg hilbert phase shift. This "automatically" induces a delay as well. */
    /* float rri = hilbert(r, delay, delay_size, delay_i); */
    /* delay_i = (delay_i+1) % delay_size; */
    /* float rli = -rri; */

    fl[i] = li;
    fr[i] = ri;
    rl[i] = rli;
    rr[i] = rri;
    ce[i] = ci;
    lfe[i] = lfei;
  }
  mixed_buffer_finish_read(frames, data->in[MIXED_LEFT]);
  mixed_buffer_finish_read(frames, data->in[MIXED_RIGHT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_LEFT_FRONT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_RIGHT_FRONT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_LEFT_REAR]);
  mixed_buffer_finish_write(frames, data->out[MIXED_RIGHT_REAR]);
  mixed_buffer_finish_write(frames, data->out[MIXED_CENTER]);
  mixed_buffer_finish_write(frames, data->out[MIXED_SUBWOOFER]);

  return 1;
}